

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_deserialize_decimal_Test::~JsonParser_deserialize_decimal_Test
          (JsonParser_deserialize_decimal_Test *this)

{
  JsonParser_deserialize_decimal_Test *this_local;
  
  ~JsonParser_deserialize_decimal_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonParser, deserialize_decimal) {
	json_parser parser;

	EXPECT_DOUBLE_EQ(parser.deserialize(u8"12.34"sv).get<double>(), 12.34);
	EXPECT_DOUBLE_EQ(parser.deserialize(u8"1234."sv).get<double>(), 1234.0);
	EXPECT_DOUBLE_EQ(parser.deserialize(u8"0.1234"sv).get<double>(), 0.1234);
	EXPECT_THROW(parser.deserialize(u8".1234"sv), std::invalid_argument);
	EXPECT_DOUBLE_EQ(parser.deserialize(u8"-12.34"sv).get<double>(), -12.34);
}